

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

SetupSendResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::setupSend
          (SetupSendResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  Builder payload;
  SourceLocation location;
  RpcConnectionState *pRVar1;
  OutgoingRpcMessage *pOVar2;
  Array<unsigned_int> *other;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>,_std::nullptr_t>
  *params_2;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef> pQVar3;
  SendInternalResult *pSVar4;
  undefined1 local_150 [16];
  Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  local_140;
  undefined1 local_138 [32];
  Event **ppEStack_118;
  EventLoop *local_110;
  undefined1 local_108 [8];
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  paf;
  SendInternalResult result;
  Question *question;
  undefined1 local_c8 [4];
  QuestionId questionId;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_a8;
  undefined1 local_a0 [72];
  undefined1 local_58 [8];
  Array<unsigned_int> exports;
  Vector<int> fds;
  bool isTailCall_local;
  RpcRequest *this_local;
  
  kj::Vector<int>::Vector((Vector<int> *)&exports.disposer);
  pRVar1 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  local_a0._40_16_ = (undefined1  [16])BuilderCapabilityTable::getTable(&this->capTable);
  rpc::Call::Builder::getParams((Builder *)local_a0,&this->callBuilder);
  kj::Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&>::Maybe
            (&local_a8);
  payload._builder.capTable = (CapTableBuilder *)local_a0._8_8_;
  payload._builder.segment = (SegmentBuilder *)local_a0._0_8_;
  payload._builder.data = (void *)local_a0._16_8_;
  payload._builder.pointers = (WirePointer *)local_a0._24_8_;
  payload._builder.dataSize = local_a0._32_4_;
  payload._builder.pointerCount = local_a0._36_2_;
  payload._builder._38_2_ = local_a0._38_2_;
  writeDescriptors((Array<unsigned_int> *)local_58,pRVar1,
                   (ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)
                   local_a0._40_16_,payload,(Vector<int> *)&exports.disposer,&local_a8);
  pOVar2 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->(&this->message);
  kj::Vector<int>::releaseAsArray((Array<int> *)local_c8,(Vector<int> *)&exports.disposer);
  (*pOVar2->_vptr_OutgoingRpcMessage[1])(pOVar2,local_c8);
  kj::Array<int>::~Array((Array<int> *)local_c8);
  pRVar1 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  result.promise.super_PromiseBase.node.ptr =
       (PromiseBase)
       anon_unknown_18::
       ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                 (&pRVar1->questions,(uint *)((long)&question + 4));
  *(bool *)((long)result.promise.super_PromiseBase.node.ptr + 0x20) = true;
  other = kj::mv<kj::Array<unsigned_int>>((Array<unsigned_int> *)local_58);
  kj::Array<unsigned_int>::operator=
            ((Array<unsigned_int> *)result.promise.super_PromiseBase.node.ptr,other);
  *(bool *)((long)result.promise.super_PromiseBase.node.ptr + 0x21) = isTailCall;
  SendInternalResult::SendInternalResult((SendInternalResult *)&paf.fulfiller.ptr);
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)(local_138 + 0x18),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,"setupSend",0xa10,0x12);
  location.function = (char *)local_110;
  location.fileName = (char *)ppEStack_118;
  location._16_8_ = local_a0._24_8_;
  kj::
  newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
            (location);
  params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                     (&this->connectionState);
  params_2 = kj::
             mv<kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>,decltype(nullptr)>>
                       ((Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>,_std::nullptr_t>
                         *)&paf);
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>,decltype(nullptr)>>
            ((kj *)local_138,params,(uint *)((long)&question + 4),params_2);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::operator=
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             &paf.fulfiller.ptr,
             (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             local_138);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             local_138);
  pQVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
           operator*((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                      *)&paf.fulfiller.ptr);
  kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&>::operator=
            ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&> *)
             ((long)result.promise.super_PromiseBase.node.ptr + 0x18),pQVar3);
  pQVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
           operator*((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                      *)&paf.fulfiller.ptr);
  kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef>((kj *)local_150,pQVar3);
  kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>::
  attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
            ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
              *)&local_140,
             (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             local_108);
  kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
  operator=((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
             *)&result.questionRef.ptr,&local_140);
  kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
  ~Promise(&local_140);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             local_150);
  pSVar4 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::SendInternalResult>
                     ((SendInternalResult *)&paf.fulfiller.ptr);
  SendInternalResult::SendInternalResult(&__return_storage_ptr__->super_SendInternalResult,pSVar4);
  __return_storage_ptr__->questionId = question._4_4_;
  __return_storage_ptr__->question = (Question *)result.promise.super_PromiseBase.node.ptr;
  kj::
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  ::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
              *)local_108);
  SendInternalResult::~SendInternalResult((SendInternalResult *)&paf.fulfiller.ptr);
  kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)local_58);
  kj::Vector<int>::~Vector((Vector<int> *)&exports.disposer);
  return __return_storage_ptr__;
}

Assistant:

SetupSendResult setupSend(bool isTailCall) {
      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.next(questionId);
      question.isAwaitingReturn = true;
      question.paramExports = kj::mv(exports);
      question.isTailCall = isTailCall;

      // Make the QuestionRef and result promise.
      SendInternalResult result;
      auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();
      result.questionRef = kj::refcounted<QuestionRef>(
          *connectionState, questionId, kj::mv(paf.fulfiller));
      question.selfRef = *result.questionRef;
      result.promise = paf.promise.attach(kj::addRef(*result.questionRef));

      return { kj::mv(result), questionId, question };
    }